

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConfigData::ConfigData(ConfigData *this,ConfigData *param_1)

{
  OrNot OVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 uVar8;
  int iVar9;
  Level LVar10;
  ConfigData *param_1_local;
  ConfigData *this_local;
  
  OVar1 = param_1->showDurations;
  this->warnings = param_1->warnings;
  this->showDurations = OVar1;
  bVar2 = param_1->listTags;
  bVar3 = param_1->listReporters;
  bVar4 = param_1->showSuccessfulTests;
  bVar5 = param_1->shouldDebugBreak;
  bVar6 = param_1->noThrow;
  bVar7 = param_1->showHelp;
  uVar8 = param_1->field_0x7;
  iVar9 = param_1->abortAfter;
  LVar10 = param_1->verbosity;
  this->listTests = param_1->listTests;
  this->listTags = bVar2;
  this->listReporters = bVar3;
  this->showSuccessfulTests = bVar4;
  this->shouldDebugBreak = bVar5;
  this->noThrow = bVar6;
  this->showHelp = bVar7;
  this->field_0x7 = uVar8;
  this->abortAfter = iVar9;
  this->verbosity = LVar10;
  std::__cxx11::string::string((string *)&this->reporterName,(string *)&param_1->reporterName);
  std::__cxx11::string::string((string *)&this->outputFilename,(string *)&param_1->outputFilename);
  std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  std::__cxx11::string::string((string *)&this->processName,(string *)&param_1->processName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->testsOrTags,&param_1->testsOrTags);
  return;
}

Assistant:

ConfigData()
        :   listTests( false ),
            listTags( false ),
            listReporters( false ),
            showSuccessfulTests( false ),
            shouldDebugBreak( false ),
            noThrow( false ),
            showHelp( false ),
            abortAfter( -1 ),
            verbosity( Verbosity::Normal ),
            warnings( WarnAbout::Nothing ),
            showDurations( ShowDurations::DefaultForReporter )
        {}